

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O1

void __thiscall tcu::TextureLevelPyramid::clearLevel(TextureLevelPyramid *this,int levelNdx)

{
  int *piVar1;
  pointer pPVar2;
  ConstPixelBufferAccess *pCVar3;
  
  de::ArrayBuffer<unsigned_char,_1UL,_1UL>::clear
            ((this->m_data).
             super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start + levelNdx);
  pPVar2 = (this->m_access).
           super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pPVar2[levelNdx].super_ConstPixelBufferAccess.m_format.order = CHANNELORDER_LAST;
  pPVar2[levelNdx].super_ConstPixelBufferAccess.m_format.type = CHANNELTYPE_LAST;
  pCVar3 = &pPVar2[levelNdx].super_ConstPixelBufferAccess;
  (pCVar3->m_size).m_data[0] = 0;
  (pCVar3->m_size).m_data[1] = 0;
  *(undefined8 *)((long)(pCVar3->m_size).m_data + 8) = 0;
  piVar1 = (int *)((long)pPVar2[levelNdx].super_ConstPixelBufferAccess.m_pitch.m_data + 4);
  piVar1[0] = 0;
  piVar1[1] = 0;
  *(undefined8 *)(piVar1 + 2) = 0;
  return;
}

Assistant:

void TextureLevelPyramid::clearLevel (int levelNdx)
{
	DE_ASSERT(!isLevelEmpty(levelNdx));

	m_data[levelNdx].clear();
	m_access[levelNdx] = PixelBufferAccess();
}